

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

qsizetype __thiscall
anon_unknown.dwarf_bb6601::qLastIndexOf<QLatin1String>
          (anon_unknown_dwarf_bb6601 *this,QLatin1String haystack,QChar needle,qsizetype from,
          CaseSensitivity cs)

{
  anon_unknown_dwarf_bb6601 *paVar1;
  char16_t cVar2;
  char16_t cVar3;
  int6 in_register_0000000a;
  anon_unknown_dwarf_bb6601 *paVar4;
  byte *pbVar5;
  anon_unknown_dwarf_bb6601 *paVar6;
  char *b;
  
  pbVar5 = (byte *)haystack.m_size;
  paVar1 = (anon_unknown_dwarf_bb6601 *)0xffffffffffffffff;
  paVar4 = paVar1;
  if (this != (anon_unknown_dwarf_bb6601 *)0x0) {
    paVar4 = (anon_unknown_dwarf_bb6601 *)CONCAT62(in_register_0000000a,needle.ucs);
    if (in_register_0000000a < 0) {
      paVar6 = paVar4 + (long)this;
      if ((long)(paVar4 + (long)this) < 0) {
        return -1;
      }
    }
    else {
      paVar6 = paVar4;
      if (this < paVar4) {
        paVar6 = this + -1;
      }
    }
    if ((int)from == 1) {
      for (; (paVar4 = paVar1, pbVar5 <= pbVar5 + (long)paVar6 &&
             (paVar4 = paVar6, (ushort)pbVar5[(long)paVar6] != (char16_t)haystack.m_data));
          paVar6 = paVar6 + -1) {
      }
    }
    else {
      cVar2 = foldCase((char16_t)haystack.m_data);
      while ((paVar4 = paVar1, pbVar5 <= pbVar5 + (long)paVar6 &&
             (cVar3 = foldCase((ushort)pbVar5[(long)paVar6]), paVar4 = paVar6, cVar3 != cVar2))) {
        paVar6 = paVar6 + -1;
      }
    }
  }
  return (qsizetype)paVar4;
}

Assistant:

static inline qsizetype qLastIndexOf(Haystack haystack, QChar needle,
                                     qsizetype from, Qt::CaseSensitivity cs) noexcept
{
    if (haystack.size() == 0)
        return -1;
    if (from < 0)
        from += haystack.size();
    else if (std::size_t(from) > std::size_t(haystack.size()))
        from = haystack.size() - 1;
    if (from >= 0) {
        char16_t c = needle.unicode();
        const auto b = haystack.data();
        auto n = b + from;
        if (cs == Qt::CaseSensitive) {
            for (; n >= b; --n)
                if (valueTypeToUtf16(*n) == c)
                    return n - b;
        } else {
            c = foldCase(c);
            for (; n >= b; --n)
                if (foldCase(valueTypeToUtf16(*n)) == c)
                    return n - b;
        }
    }
    return -1;
}